

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O2

void __thiscall
TEST_MockExpectedCallsList_onlyKeepUnmatchingExpectations_Test::
~TEST_MockExpectedCallsList_onlyKeepUnmatchingExpectations_Test
          (TEST_MockExpectedCallsList_onlyKeepUnmatchingExpectations_Test *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x30);
  return;
}

Assistant:

TEST(MockExpectedCallsList, onlyKeepUnmatchingExpectations)
{
    call1->withName("relate");
    call2->withName("unrelate");
    call3->withName("relate").withParameter("param",1);
    list->addExpectedCall(call1);
    list->addExpectedCall(call2);
    list->addExpectedCall(call3);
    list->onlyKeepUnmatchingExpectations();
    LONGS_EQUAL(1, list->size());
}